

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void stack_init(lua_State *L1,lua_State *L)

{
  StkId pTVar1;
  long lVar2;
  
  pTVar1 = (StkId)luaM_realloc_(L,(void *)0x0,0,0x280);
  L1->stack = pTVar1;
  L1->stacksize = 0x28;
  lVar2 = 8;
  do {
    *(undefined4 *)((long)&pTVar1->value_ + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x288);
  L1->stack_last = pTVar1 + 0x23;
  (L1->base_ci).callstatus = 0;
  (L1->base_ci).previous = (CallInfo *)0x0;
  (L1->base_ci).next = (CallInfo *)0x0;
  (L1->base_ci).func = pTVar1;
  L1->top = pTVar1 + 1;
  pTVar1->tt_ = 0;
  (L1->base_ci).top = pTVar1 + 0x15;
  L1->ci = &L1->base_ci;
  return;
}

Assistant:

static void stack_init(lua_State *L1, lua_State *L) {
    int i;
    CallInfo *ci;
    /* initialize stack array */
    L1->stack = luaM_newvector(L, BASIC_STACK_SIZE, TValue);
    L1->stacksize = BASIC_STACK_SIZE;
    for (i = 0; i < BASIC_STACK_SIZE; i++)
        setnilvalue(L1->stack + i);  /* erase new stack */
    L1->top = L1->stack;
    L1->stack_last = L1->stack + L1->stacksize - EXTRA_STACK;
    /* initialize first ci */
    ci = &L1->base_ci;
    ci->next = ci->previous = NULL;
    ci->callstatus = 0;
    ci->func = L1->top;
    setnilvalue(L1->top++);  /* 'function' entry for this 'ci' */
    ci->top = L1->top + LUA_MINSTACK;
    L1->ci = ci;
}